

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianEdgeCalculator.cpp
# Opt level: O0

void __thiscall
GaussianEdgeCalculator::GaussianEdgeCalculator
          (GaussianEdgeCalculator *this,double significance_level,double insert_size_mean,
          double insert_size_stddev)

{
  _func_int **p;
  EdgeCalculator *in_RDI;
  _func_int **in_XMM0_Qa;
  double dVar1;
  _func_int **in_XMM1_Qa;
  _func_int **in_XMM2_Qa;
  complemented2_type<boost::math::normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_double>
  cVar2;
  normal norm2;
  size_t x;
  normal norm;
  double *in_stack_ffffffffffffff58;
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_stack_ffffffffffffff60;
  double *in_stack_ffffffffffffff68;
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_stack_ffffffffffffff70;
  complemented2_type<boost::math::normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_double>
  *in_stack_ffffffffffffff98;
  ulong local_48;
  
  EdgeCalculator::EdgeCalculator(in_RDI);
  in_RDI->_vptr_EdgeCalculator = (_func_int **)&PTR__GaussianEdgeCalculator_00352e60;
  in_RDI[1]._vptr_EdgeCalculator = in_XMM0_Qa;
  in_RDI[2]._vptr_EdgeCalculator = in_XMM1_Qa;
  in_RDI[3]._vptr_EdgeCalculator = in_XMM2_Qa;
  p = (_func_int **)operator_new__(0x4b320);
  in_RDI[5]._vptr_EdgeCalculator = p;
  boost::math::
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::normal_distribution
            (in_stack_ffffffffffffff70,(double)in_stack_ffffffffffffff68,
             (double)in_stack_ffffffffffffff60);
  cVar2.param = in_stack_ffffffffffffff68;
  cVar2.dist = in_stack_ffffffffffffff70;
  for (local_48 = 0; local_48 < 0x9664; local_48 = local_48 + 1) {
    cVar2 = boost::math::
            complement<boost::math::normal_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>,double>
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff60 =
         (normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
          *)boost::math::
            cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      (in_stack_ffffffffffffff98);
    in_RDI[5]._vptr_EdgeCalculator[local_48] = (_func_int *)in_stack_ffffffffffffff60;
  }
  boost::math::
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::normal_distribution(cVar2.dist,(double)cVar2.param,(double)in_stack_ffffffffffffff60);
  dVar1 = boost::math::
          quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                      *)((double)in_XMM0_Qa * 0.5),(double *)p);
  dVar1 = floor(-dVar1);
  *(int *)&in_RDI[4]._vptr_EdgeCalculator = (int)dVar1;
  return;
}

Assistant:

GaussianEdgeCalculator::GaussianEdgeCalculator(double significance_level, double insert_size_mean, double insert_size_stddev) {
	this->significance_level = significance_level;
	this->insert_size_popmean = insert_size_mean;
	this->insert_size_popstddev = insert_size_stddev;
	cached_survival_function = new double[SF_CACHE_SIZE];
	boost::math::normal norm;
	for (size_t x=0; x<SF_CACHE_SIZE; ++x) {
		cached_survival_function[x] = boost::math::cdf(boost::math::complement(norm,x*SF_CACHE_FACTOR));
	}
	boost::math::normal norm2(0,sqrt2*insert_size_stddev);
	this->allowable_insert_size_diff = (int)floor(-boost::math::quantile(norm2, significance_level/2.0));
	// cout << "allowable insert size difference: " << allowable_insert_size_diff << endl;
}